

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

int __thiscall ON_PointCloud::RemoveRange(ON_PointCloud *this,int count,int *pIndices)

{
  uint i_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  bool *pbVar11;
  uint local_74;
  uint i_1;
  uint point_index;
  uint i;
  uint last_point_count;
  uint points_removed;
  bool bHaveHidden;
  bool bHaveValues;
  bool bHaveColors;
  bool bHaveNormals;
  uint index_count;
  undefined1 local_48 [8];
  ON_SimpleArray<int> indices;
  uint point_count;
  int *pIndices_local;
  int count_local;
  ON_PointCloud *this_local;
  
  indices.m_capacity =
       ON_SimpleArray<ON_3dPoint>::UnsignedCount(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
  if (((indices.m_capacity == 0) || (count < 1)) || (pIndices == (int *)0x0)) {
    this_local._4_4_ = 0;
  }
  else {
    ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_48,(long)count);
    ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_48,count,pIndices);
    ON_SimpleArray<int>::QuickSortAndRemoveDuplicates
              ((ON_SimpleArray<int> *)local_48,ON_CompareDecreasing<int>);
    uVar5 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)local_48);
    iVar1 = indices.m_capacity;
    if (uVar5 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      uVar6 = ON_SimpleArray<ON_3dVector>::UnsignedCount(&this->m_N);
      iVar2 = indices.m_capacity;
      uVar7 = ON_SimpleArray<ON_Color>::UnsignedCount(&this->m_C);
      iVar3 = indices.m_capacity;
      uVar8 = ON_SimpleArray<double>::UnsignedCount(&this->m_V);
      iVar4 = indices.m_capacity;
      uVar9 = ON_SimpleArray<bool>::UnsignedCount(&this->m_H);
      i = 0;
      point_index = indices.m_capacity;
      for (i_1 = 0; i_1 < uVar5; i_1 = i_1 + 1) {
        puVar10 = (uint *)ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_48,i_1);
        i_00 = *puVar10;
        if (i_00 < (uint)indices.m_capacity) {
          ON_SimpleArray<ON_3dPoint>::Swap
                    (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,i_00,point_index - 1);
          if (iVar1 == uVar6) {
            ON_SimpleArray<ON_3dVector>::Swap(&this->m_N,i_00,point_index - 1);
          }
          if (iVar2 == uVar7) {
            ON_SimpleArray<ON_Color>::Swap(&this->m_C,i_00,point_index - 1);
          }
          if (iVar3 == uVar8) {
            ON_SimpleArray<double>::Swap(&this->m_V,i_00,point_index - 1);
          }
          if (iVar4 == uVar9) {
            ON_SimpleArray<bool>::Swap(&this->m_H,i_00,point_index - 1);
          }
          i = i + 1;
          point_index = point_index - 1;
          if (point_index == 0) break;
        }
      }
      ON_SimpleArray<ON_3dPoint>::SetCount
                (&(this->m_P).super_ON_SimpleArray<ON_3dPoint>,point_index);
      ON_SimpleArray<ON_3dPoint>::Shrink(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
      if (iVar1 == uVar6) {
        ON_SimpleArray<ON_3dVector>::SetCount(&this->m_N,point_index);
        ON_SimpleArray<ON_3dVector>::Shrink(&this->m_N);
      }
      if (iVar2 == uVar7) {
        ON_SimpleArray<ON_Color>::SetCount(&this->m_C,point_index);
        ON_SimpleArray<ON_Color>::Shrink(&this->m_C);
      }
      if (iVar3 == uVar8) {
        ON_SimpleArray<double>::SetCount(&this->m_V,point_index);
        ON_SimpleArray<double>::Shrink(&this->m_V);
      }
      if (iVar4 == uVar9) {
        ON_SimpleArray<bool>::SetCount(&this->m_H,point_index);
        ON_SimpleArray<bool>::Shrink(&this->m_H);
        this->m_hidden_count = 0;
        for (local_74 = 0; uVar5 = ON_SimpleArray<bool>::UnsignedCount(&this->m_H), local_74 < uVar5
            ; local_74 = local_74 + 1) {
          pbVar11 = ON_SimpleArray<bool>::operator[](&this->m_H,local_74);
          if ((*pbVar11 & 1U) != 0) {
            this->m_hidden_count = this->m_hidden_count + 1;
          }
        }
        InvalidateBoundingBox(this);
      }
      this_local._4_4_ = i;
    }
    ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

int ON_PointCloud::RemoveRange(int count, const int* pIndices)
{
  const unsigned int point_count = m_P.UnsignedCount();
  if (0 == point_count || count <= 0 || nullptr == pIndices)
    return 0;

  ON_SimpleArray<int> indices(count);
  indices.Append(count, pIndices);
  indices.QuickSortAndRemoveDuplicates(ON_CompareDecreasing<int>);

  const unsigned int index_count = indices.Count();
  if (index_count <= 0)
    return 0;

  const bool bHaveNormals = point_count == m_N.UnsignedCount();
  const bool bHaveColors = point_count == m_C.UnsignedCount();
  const bool bHaveValues = point_count == m_V.UnsignedCount();
  const bool bHaveHidden = point_count == m_H.UnsignedCount();

  unsigned int points_removed = 0;
  unsigned int last_point_count = point_count;
  for (unsigned int i = 0; i < index_count; i++)
  {
    const unsigned int point_index = indices[i];
    if (point_index >= 0 && point_index < point_count)
    {
      m_P.Swap(point_index, last_point_count - 1);
      if (bHaveNormals)
        m_N.Swap(point_index, last_point_count - 1);
      if (bHaveColors)
        m_C.Swap(point_index, last_point_count - 1);
      if (bHaveValues)
        m_V.Swap(point_index, last_point_count - 1);
      if (bHaveHidden)
        m_H.Swap(point_index, last_point_count - 1);

      points_removed++;
      last_point_count--;
      if (last_point_count <= 0)
        break;
    }
  }

  m_P.SetCount(last_point_count);
  m_P.Shrink();
  if (bHaveNormals)
  {
    m_N.SetCount(last_point_count);
    m_N.Shrink();
  }
  if (bHaveColors)
  {
    m_C.SetCount(last_point_count);
    m_C.Shrink();
  }
  if (bHaveValues)
  {
    m_V.SetCount(last_point_count);
    m_V.Shrink();
  }
  if (bHaveHidden)
  {
    m_H.SetCount(last_point_count);
    m_H.Shrink();
    m_hidden_count = 0;
    for (unsigned int i = 0; i < m_H.UnsignedCount(); i++)
    {
      if (m_H[i])
        m_hidden_count++;
    }
    InvalidateBoundingBox();
  }

  return points_removed;
}